

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

void slang::lshrFar(uint64_t *dst,uint64_t *src,uint32_t wordShift,uint32_t offset,uint32_t start,
                   uint32_t numWords)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = numWords + start;
  if (wordShift == 0) {
    if (start < iVar3 - offset) {
      uVar2 = (ulong)start;
      do {
        dst[uVar2] = src[offset + (int)uVar2];
        uVar2 = uVar2 + 1;
      } while (iVar3 - offset != uVar2);
    }
    return;
  }
  uVar4 = ~offset + iVar3;
  bVar1 = (byte)wordShift;
  if (start < uVar4) {
    uVar2 = (ulong)start;
    do {
      dst[uVar2] = src[offset + 1 + (int)uVar2] << (0x40 - bVar1 & 0x3f) |
                   src[offset + (int)uVar2] >> (bVar1 & 0x3f);
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  dst[uVar4] = src[iVar3 - 1] >> (bVar1 & 0x3f);
  return;
}

Assistant:

static void lshrFar(uint64_t* dst, uint64_t* src, uint32_t wordShift, uint32_t offset,
                    uint32_t start, uint32_t numWords) {
    // this function is split out so that if we have an unknown value we can reuse the code
    // optimization: move whole words
    if (wordShift == 0) {
        for (uint32_t i = start; i < start + numWords - offset; i++)
            dst[i] = src[i + offset];
    }
    else {
        // shift low order words
        uint32_t breakWord = start + numWords - offset - 1;
        for (uint32_t i = start; i < breakWord; i++) {
            dst[i] = (src[i + offset] >> wordShift) |
                     (src[i + offset + 1] << (SVInt::BITS_PER_WORD - wordShift));
        }

        // shift the "break" word
        dst[breakWord] = src[breakWord + offset] >> wordShift;
    }
}